

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * __thiscall Sections::ToString_abi_cxx11_(string *__return_storage_ptr__,Sections *this)

{
  string *this_00;
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pSVar3;
  size_t sVar4;
  pointer pcVar5;
  ulong uVar6;
  bool bVar7;
  void *pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  ulong __pos;
  size_type __n;
  pointer pSVar12;
  long in_FS_OFFSET;
  string right;
  string left;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pSVar12 = (this->m_sections).super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar3 = (this->m_sections).super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar12 != pSVar3) {
    __n = this->m_max_pad + 4;
    paVar2 = &local_98.field_2;
    do {
      sVar4 = (pSVar12->m_left)._M_string_length;
      if (sVar4 == 0) {
        bVar7 = true;
      }
      else {
        pcVar5 = (pSVar12->m_left)._M_dataplus._M_p;
        pvVar8 = memchr(pcVar5,10,sVar4);
        bVar7 = (long)pvVar8 - (long)pcVar5 == -1 || pvVar8 == (void *)0x0;
      }
      local_58._M_dataplus._M_p._0_1_ = bVar7;
      inline_check_non_fatal<bool>
                ((bool *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                 ,0x205,"ToString","s.m_left.find(\'\\n\') == std::string::npos");
      if ((pSVar12->m_right)._M_string_length == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,(pSVar12->m_left)._M_dataplus._M_p,
                   (pSVar12->m_left)._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,"\n");
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        pcVar5 = (pSVar12->m_left)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar5,pcVar5 + (pSVar12->m_left)._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  (&local_58,__n,' ');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        this_00 = &pSVar12->m_right;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        sVar4 = (pSVar12->m_right)._M_string_length;
        if (sVar4 == 0) {
          uVar11 = 0xffffffffffffffff;
        }
        else {
          pcVar5 = (this_00->_M_dataplus)._M_p;
          pvVar8 = memchr(pcVar5,10,sVar4);
          uVar11 = -(ulong)(pvVar8 == (void *)0x0) | (long)pvVar8 - (long)pcVar5;
        }
        __pos = 0;
        while( true ) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_98,this_00,__pos,uVar11 - __pos);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_78,local_98._M_dataplus._M_p,local_98._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if (uVar11 == 0xffffffffffffffff) break;
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_b8,__n,' ');
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_b8,0,0,"\n",1);
          local_98._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
          paVar10 = &pbVar9->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p == paVar10) {
            local_98.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
            local_98._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_98.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_98._M_string_length = pbVar9->_M_string_length;
          (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar9->_M_string_length = 0;
          (pbVar9->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_78,local_98._M_dataplus._M_p,local_98._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          uVar11 = uVar11 + 1;
          uVar6 = (pSVar12->m_right)._M_string_length;
          __pos = 0xffffffffffffffff;
          if (uVar11 < uVar6) {
            do {
              __pos = uVar11;
              if ((this_00->_M_dataplus)._M_p[uVar11] != ' ') break;
              uVar11 = uVar11 + 1;
              __pos = 0xffffffffffffffff;
            } while (uVar6 != uVar11);
          }
          if (__pos == 0xffffffffffffffff) break;
          uVar1 = __pos + 1;
          uVar11 = 0xffffffffffffffff;
          if (uVar1 <= uVar6 && uVar6 - uVar1 != 0) {
            pcVar5 = (this_00->_M_dataplus)._M_p;
            pvVar8 = memchr(pcVar5 + uVar1,10,uVar6 - uVar1);
            uVar11 = -(ulong)(pvVar8 == (void *)0x0) | (long)pvVar8 - (long)pcVar5;
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_78._M_dataplus._M_p,local_78._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,"\n");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      pSVar12 = pSVar12 + 1;
    } while (pSVar12 != pSVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::string ret;
        const size_t pad = m_max_pad + 4;
        for (const auto& s : m_sections) {
            // The left part of a section is assumed to be a single line, usually it is the name of the JSON struct or a
            // brace like {, }, [, or ]
            CHECK_NONFATAL(s.m_left.find('\n') == std::string::npos);
            if (s.m_right.empty()) {
                ret += s.m_left;
                ret += "\n";
                continue;
            }

            std::string left = s.m_left;
            left.resize(pad, ' ');
            ret += left;

            // Properly pad after newlines
            std::string right;
            size_t begin = 0;
            size_t new_line_pos = s.m_right.find_first_of('\n');
            while (true) {
                right += s.m_right.substr(begin, new_line_pos - begin);
                if (new_line_pos == std::string::npos) {
                    break; //No new line
                }
                right += "\n" + std::string(pad, ' ');
                begin = s.m_right.find_first_not_of(' ', new_line_pos + 1);
                if (begin == std::string::npos) {
                    break; // Empty line
                }
                new_line_pos = s.m_right.find_first_of('\n', begin + 1);
            }
            ret += right;
            ret += "\n";
        }
        return ret;
    }